

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_init_simple_motion_search_mvs_for_sb
               (AV1_COMP *cpi,TileInfo *tile_info,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_root,
               int mi_row,int mi_col)

{
  long lVar1;
  FULLPEL_MV FVar2;
  MV *subpel_mv;
  ulong uVar3;
  FULLPEL_MV ref_mvs [8];
  MB_MODE_INFO_EXT mbmi_ext;
  
  ref_mvs[4].row = 0;
  ref_mvs[4].col = 0;
  ref_mvs[5].row = 0;
  ref_mvs[5].col = 0;
  ref_mvs[6].row = 0;
  ref_mvs[6].col = 0;
  ref_mvs[7].row = 0;
  ref_mvs[7].col = 0;
  ref_mvs[0].row = 0;
  ref_mvs[0].col = 0;
  ref_mvs[1].row = 0;
  ref_mvs[1].col = 0;
  ref_mvs[2].row = 0;
  ref_mvs[2].col = 0;
  ref_mvs[3].row = 0;
  ref_mvs[3].col = 0;
  if (tile_info != (TileInfo *)0x0) {
    av1_set_offsets_without_segment_id
              (cpi,tile_info,x,mi_row,mi_col,((cpi->common).seq_params)->sb_size);
  }
  lVar1 = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    lVar1 = 1;
  }
  av1_find_mv_refs(&cpi->common,&x->e_mbd,*(x->e_mbd).mi,(MV_REFERENCE_FRAME)lVar1,
                   mbmi_ext.ref_mv_count,(x->e_mbd).ref_mv_stack,(x->e_mbd).weight,
                   (int_mv (*) [2])0x0,mbmi_ext.global_mvs,mbmi_ext.mode_context);
  uVar3 = (ulong)(uint)((int)lVar1 * 4);
  subpel_mv = (MV *)((long)&(x->e_mbd).ref_mv_stack[0][0].this_mv + (ulong)(uint)((int)lVar1 << 6));
  if (mbmi_ext.ref_mv_count[lVar1] == '\0') {
    subpel_mv = (MV *)((long)mbmi_ext.global_mvs + uVar3);
  }
  FVar2 = get_fullmv_from_mv(subpel_mv);
  *(FULLPEL_MV *)((long)&ref_mvs[0].row + uVar3) = FVar2;
  init_simple_motion_search_mvs(sms_root,ref_mvs);
  return;
}

Assistant:

void av1_init_simple_motion_search_mvs_for_sb(const AV1_COMP *cpi,
                                              const TileInfo *tile_info,
                                              MACROBLOCK *x,
                                              SIMPLE_MOTION_DATA_TREE *sms_root,
                                              int mi_row, int mi_col) {
  // Use the NEARESTMV of the sb as the start mv
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  FULLPEL_MV ref_mvs[REF_FRAMES];
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  av1_zero(ref_mvs);
  // If tile_info is NULL, assume that the offsets have already been set.
  if (tile_info) {
    av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col,
                                       sb_size);
  }

  MB_MODE_INFO_EXT mbmi_ext;
  const int ref_frame =
      cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
  av1_find_mv_refs(cm, xd, xd->mi[0], ref_frame, mbmi_ext.ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext.global_mvs,
                   mbmi_ext.mode_context);
  if (mbmi_ext.ref_mv_count[ref_frame] > 0) {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&xd->ref_mv_stack[ref_frame][0].this_mv.as_mv);
  } else {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&mbmi_ext.global_mvs[ref_frame].as_mv);
  }

  init_simple_motion_search_mvs(sms_root, ref_mvs);
}